

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpegtran.c
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  int extraout_EAX;
  boolean bVar2;
  FILE *pFVar3;
  FILE *pFVar4;
  jvirt_barray_ptr *src_coef_arrays;
  jvirt_barray_ptr *coef_arrays;
  JOCTET *icc_data_ptr;
  size_t sVar5;
  char *pcVar6;
  char *__format;
  boolean in_R8D;
  size_t __size;
  bool bVar7;
  cdjpeg_progress_mgr dst_progress;
  cdjpeg_progress_mgr src_progress;
  jpeg_error_mgr jdsterr;
  jpeg_error_mgr jsrcerr;
  jpeg_decompress_struct srcinfo;
  jpeg_compress_struct dstinfo;
  jpeg_error_mgr jdroperr;
  jpeg_decompress_struct dropinfo;
  
  progname = *argv;
  if ((progname == (char *)0x0) || (*progname == '\0')) {
    progname = "jpegtran";
  }
  srcinfo.err = jpeg_std_error(&jsrcerr);
  jpeg_CreateDecompress(&srcinfo,0x3e,0x278);
  dstinfo.err = jpeg_std_error(&jdsterr);
  jpeg_CreateCompress(&dstinfo,0x3e,0x208);
  iVar1 = parse_switches(&dstinfo,argc,argv,0,in_R8D);
  jsrcerr.trace_level = jdsterr.trace_level;
  (srcinfo.mem)->max_memory_to_use = (dstinfo.mem)->max_memory_to_use;
  if (strict != 0) {
    jsrcerr.emit_message = my_emit_message;
  }
  if (iVar1 < argc + -1) {
    fprintf(_stderr,"%s: only one input file\n",progname);
    usage();
    iVar1 = extraout_EAX;
  }
  if (iVar1 < argc) {
    pFVar3 = fopen(argv[iVar1],"rb");
    if (pFVar3 != (FILE *)0x0) goto LAB_001053d5;
    pcVar6 = argv[iVar1];
LAB_001054cc:
    __format = "%s: can\'t open %s for reading\n";
  }
  else {
    pFVar3 = (FILE *)read_stdin();
LAB_001053d5:
    icc_data_ptr = (JOCTET *)0x0;
    __size = 0;
    if (icc_filename == (char *)0x0) {
LAB_001053ea:
      if (report == 0) {
        bVar7 = false;
      }
      else {
        start_progress_monitor((j_common_ptr)&dstinfo,&dst_progress);
        dst_progress.report = report;
        bVar7 = report != 0;
      }
      if ((bVar7) || (max_scans != 0)) {
        start_progress_monitor((j_common_ptr)&srcinfo,&src_progress);
        src_progress.report = report;
        src_progress.max_scans = max_scans;
      }
      if (dropfilename == (char *)0x0) {
        pFVar4 = (FILE *)0x0;
      }
      else {
        pFVar4 = fopen(dropfilename,"rb");
        pcVar6 = dropfilename;
        if (pFVar4 == (FILE *)0x0) goto LAB_001054cc;
        dropinfo.err = jpeg_std_error(&jdroperr);
        jpeg_CreateDecompress(&dropinfo,0x3e,0x278);
        jpeg_stdio_src(&dropinfo,(FILE *)pFVar4);
      }
      jpeg_stdio_src(&srcinfo,(FILE *)pFVar3);
      jcopy_markers_setup(&srcinfo,copyoption);
      jpeg_read_header(&srcinfo,1);
      if (dropfilename != (char *)0x0) {
        jpeg_read_header(&dropinfo,1);
        transformoption.crop_width = dropinfo.image_width;
        transformoption.crop_height = dropinfo.image_height;
        transformoption.crop_width_set = JCROP_POS;
        transformoption.crop_height_set = JCROP_POS;
        transformoption.drop_ptr = &dropinfo;
      }
      bVar2 = jtransform_request_workspace(&srcinfo,&transformoption);
      if (bVar2 == 0) {
        fprintf(_stderr,"%s: transformation is not perfect\n",progname);
        goto LAB_00105533;
      }
      src_coef_arrays = jpeg_read_coefficients(&srcinfo);
      if (dropfilename != (char *)0x0) {
        transformoption.drop_coef_arrays = jpeg_read_coefficients(&dropinfo);
      }
      jpeg_copy_critical_parameters(&srcinfo,&dstinfo);
      coef_arrays = jtransform_adjust_parameters(&srcinfo,&dstinfo,src_coef_arrays,&transformoption)
      ;
      if (pFVar3 != _stdin) {
        fclose(pFVar3);
      }
      if (outfilename == (char *)0x0) {
        pFVar3 = (FILE *)write_stdout();
LAB_001056eb:
        parse_switches(&dstinfo,argc,argv,1,in_R8D);
        jpeg_stdio_dest(&dstinfo,(FILE *)pFVar3);
        jpeg_write_coefficients(&dstinfo,coef_arrays);
        jcopy_markers_execute(&srcinfo,&dstinfo,copyoption);
        if (icc_data_ptr != (JOCTET *)0x0) {
          jpeg_write_icc_profile(&dstinfo,icc_data_ptr,(uint)__size);
        }
        jtransform_execute_transform(&srcinfo,&dstinfo,src_coef_arrays,&transformoption);
        jpeg_finish_compress(&dstinfo);
        jpeg_destroy_compress(&dstinfo);
        if (dropfilename != (char *)0x0) {
          jpeg_finish_decompress(&dropinfo);
          jpeg_destroy_decompress(&dropinfo);
        }
        jpeg_finish_decompress(&srcinfo);
        jpeg_destroy_decompress(&srcinfo);
        if (pFVar3 != _stdout) {
          fclose(pFVar3);
        }
        if (pFVar4 != (FILE *)0x0) {
          fclose(pFVar4);
        }
        if (report == 0) {
          bVar7 = false;
        }
        else {
          end_progress_monitor((j_common_ptr)&dstinfo);
          bVar7 = report != 0;
        }
        if ((bVar7) || (max_scans != 0)) {
          end_progress_monitor((j_common_ptr)&srcinfo);
        }
        free(icc_data_ptr);
        if (dropfilename != (char *)0x0) {
          jsrcerr.num_warnings = jsrcerr.num_warnings + jdroperr.num_warnings;
        }
        exit((uint)(jsrcerr.num_warnings + jdsterr.num_warnings != 0) * 2);
      }
      pFVar3 = fopen(outfilename,"wb");
      if (pFVar3 != (FILE *)0x0) goto LAB_001056eb;
      __format = "%s: can\'t open %s for writing\n";
      pcVar6 = outfilename;
    }
    else {
      pFVar4 = fopen(icc_filename,"rb");
      if (pFVar4 == (FILE *)0x0) {
        __format = "%s: can\'t open %s\n";
        pcVar6 = icc_filename;
      }
      else {
        iVar1 = fseek(pFVar4,0,2);
        if (((-1 < iVar1) && (__size = ftell(pFVar4), 0 < (long)__size)) &&
           (iVar1 = fseek(pFVar4,0,0), -1 < iVar1)) {
          icc_data_ptr = (JOCTET *)malloc(__size);
          if (icc_data_ptr == (JOCTET *)0x0) {
            fprintf(_stderr,"%s: can\'t allocate memory for ICC profile\n",progname);
          }
          else {
            sVar5 = fread(icc_data_ptr,__size,1,pFVar4);
            if (sVar5 != 0) {
              fclose(pFVar4);
              if (copyoption == JCOPYOPT_ALL) {
                copyoption = JCOPYOPT_ALL_EXCEPT_ICC;
              }
              else if (copyoption == JCOPYOPT_ICC) {
                copyoption = JCOPYOPT_NONE;
              }
              goto LAB_001053ea;
            }
            fprintf(_stderr,"%s: can\'t read ICC profile from %s\n",progname,icc_filename);
            free(icc_data_ptr);
          }
          fclose(pFVar4);
          goto LAB_00105533;
        }
        __format = "%s: can\'t determine size of %s\n";
        pcVar6 = icc_filename;
      }
    }
  }
  fprintf(_stderr,__format,progname,pcVar6);
LAB_00105533:
  exit(1);
}

Assistant:

int
main(int argc, char **argv)
{
  struct jpeg_decompress_struct srcinfo;
#if TRANSFORMS_SUPPORTED
  struct jpeg_decompress_struct dropinfo;
  struct jpeg_error_mgr jdroperr;
  FILE *drop_file;
#endif
  struct jpeg_compress_struct dstinfo;
  struct jpeg_error_mgr jsrcerr, jdsterr;
  struct cdjpeg_progress_mgr src_progress, dst_progress;
  jvirt_barray_ptr *src_coef_arrays;
  jvirt_barray_ptr *dst_coef_arrays;
  int file_index;
  /* We assume all-in-memory processing and can therefore use only a
   * single file pointer for sequential input and output operation.
   */
  FILE *fp;
  FILE *icc_file;
  JOCTET *icc_profile = NULL;
  long icc_len = 0;

  /* On Mac, fetch a command line. */
#ifdef USE_CCOMMAND
  argc = ccommand(&argv);
#endif

  progname = argv[0];
  if (progname == NULL || progname[0] == 0)
    progname = "jpegtran";      /* in case C library doesn't provide it */

  /* Initialize the JPEG decompression object with default error handling. */
  srcinfo.err = jpeg_std_error(&jsrcerr);
  jpeg_create_decompress(&srcinfo);
  /* Initialize the JPEG compression object with default error handling. */
  dstinfo.err = jpeg_std_error(&jdsterr);
  jpeg_create_compress(&dstinfo);

  /* Scan command line to find file names.
   * It is convenient to use just one switch-parsing routine, but the switch
   * values read here are mostly ignored; we will rescan the switches after
   * opening the input file.  Also note that most of the switches affect the
   * destination JPEG object, so we parse into that and then copy over what
   * needs to affect the source too.
   */

  file_index = parse_switches(&dstinfo, argc, argv, 0, FALSE);
  jsrcerr.trace_level = jdsterr.trace_level;
  srcinfo.mem->max_memory_to_use = dstinfo.mem->max_memory_to_use;

  if (strict)
    jsrcerr.emit_message = my_emit_message;

#ifdef TWO_FILE_COMMANDLINE
  /* Must have either -outfile switch or explicit output file name */
  if (outfilename == NULL) {
    if (file_index != argc - 2) {
      fprintf(stderr, "%s: must name one input and one output file\n",
              progname);
      usage();
    }
    outfilename = argv[file_index + 1];
  } else {
    if (file_index != argc - 1) {
      fprintf(stderr, "%s: must name one input and one output file\n",
              progname);
      usage();
    }
  }
#else
  /* Unix style: expect zero or one file name */
  if (file_index < argc - 1) {
    fprintf(stderr, "%s: only one input file\n", progname);
    usage();
  }
#endif /* TWO_FILE_COMMANDLINE */

  /* Open the input file. */
  if (file_index < argc) {
    if ((fp = fopen(argv[file_index], READ_BINARY)) == NULL) {
      fprintf(stderr, "%s: can't open %s for reading\n", progname,
              argv[file_index]);
      exit(EXIT_FAILURE);
    }
  } else {
    /* default input file is stdin */
    fp = read_stdin();
  }

  if (icc_filename != NULL) {
    if ((icc_file = fopen(icc_filename, READ_BINARY)) == NULL) {
      fprintf(stderr, "%s: can't open %s\n", progname, icc_filename);
      exit(EXIT_FAILURE);
    }
    if (fseek(icc_file, 0, SEEK_END) < 0 ||
        (icc_len = ftell(icc_file)) < 1 ||
        fseek(icc_file, 0, SEEK_SET) < 0) {
      fprintf(stderr, "%s: can't determine size of %s\n", progname,
              icc_filename);
      exit(EXIT_FAILURE);
    }
    if ((icc_profile = (JOCTET *)malloc(icc_len)) == NULL) {
      fprintf(stderr, "%s: can't allocate memory for ICC profile\n", progname);
      fclose(icc_file);
      exit(EXIT_FAILURE);
    }
    if (fread(icc_profile, icc_len, 1, icc_file) < 1) {
      fprintf(stderr, "%s: can't read ICC profile from %s\n", progname,
              icc_filename);
      free(icc_profile);
      fclose(icc_file);
      exit(EXIT_FAILURE);
    }
    fclose(icc_file);
    if (copyoption == JCOPYOPT_ALL)
      copyoption = JCOPYOPT_ALL_EXCEPT_ICC;
    if (copyoption == JCOPYOPT_ICC)
      copyoption = JCOPYOPT_NONE;
  }

  if (report) {
    start_progress_monitor((j_common_ptr)&dstinfo, &dst_progress);
    dst_progress.report = report;
  }
  if (report || max_scans != 0) {
    start_progress_monitor((j_common_ptr)&srcinfo, &src_progress);
    src_progress.report = report;
    src_progress.max_scans = max_scans;
  }
#if TRANSFORMS_SUPPORTED
  /* Open the drop file. */
  if (dropfilename != NULL) {
    if ((drop_file = fopen(dropfilename, READ_BINARY)) == NULL) {
      fprintf(stderr, "%s: can't open %s for reading\n", progname,
              dropfilename);
      exit(EXIT_FAILURE);
    }
    dropinfo.err = jpeg_std_error(&jdroperr);
    jpeg_create_decompress(&dropinfo);
    jpeg_stdio_src(&dropinfo, drop_file);
  } else {
    drop_file = NULL;
  }
#endif

  /* Specify data source for decompression */
  jpeg_stdio_src(&srcinfo, fp);

  /* Enable saving of extra markers that we want to copy */
  jcopy_markers_setup(&srcinfo, copyoption);

  /* Read file header */
  (void)jpeg_read_header(&srcinfo, TRUE);

#if TRANSFORMS_SUPPORTED
  if (dropfilename != NULL) {
    (void)jpeg_read_header(&dropinfo, TRUE);
    transformoption.crop_width = dropinfo.image_width;
    transformoption.crop_width_set = JCROP_POS;
    transformoption.crop_height = dropinfo.image_height;
    transformoption.crop_height_set = JCROP_POS;
    transformoption.drop_ptr = &dropinfo;
  }
#endif

  /* Any space needed by a transform option must be requested before
   * jpeg_read_coefficients so that memory allocation will be done right.
   */
#if TRANSFORMS_SUPPORTED
  /* Fail right away if -perfect is given and transformation is not perfect.
   */
  if (!jtransform_request_workspace(&srcinfo, &transformoption)) {
    fprintf(stderr, "%s: transformation is not perfect\n", progname);
    exit(EXIT_FAILURE);
  }
#endif

  /* Read source file as DCT coefficients */
  src_coef_arrays = jpeg_read_coefficients(&srcinfo);

#if TRANSFORMS_SUPPORTED
  if (dropfilename != NULL) {
    transformoption.drop_coef_arrays = jpeg_read_coefficients(&dropinfo);
  }
#endif

  /* Initialize destination compression parameters from source values */
  jpeg_copy_critical_parameters(&srcinfo, &dstinfo);

  /* Adjust destination parameters if required by transform options;
   * also find out which set of coefficient arrays will hold the output.
   */
#if TRANSFORMS_SUPPORTED
  dst_coef_arrays = jtransform_adjust_parameters(&srcinfo, &dstinfo,
                                                 src_coef_arrays,
                                                 &transformoption);
#else
  dst_coef_arrays = src_coef_arrays;
#endif

  /* Close input file, if we opened it.
   * Note: we assume that jpeg_read_coefficients consumed all input
   * until JPEG_REACHED_EOI, and that jpeg_finish_decompress will
   * only consume more while (!cinfo->inputctl->eoi_reached).
   * We cannot call jpeg_finish_decompress here since we still need the
   * virtual arrays allocated from the source object for processing.
   */
  if (fp != stdin)
    fclose(fp);

  /* Open the output file. */
  if (outfilename != NULL) {
    if ((fp = fopen(outfilename, WRITE_BINARY)) == NULL) {
      fprintf(stderr, "%s: can't open %s for writing\n", progname,
              outfilename);
      exit(EXIT_FAILURE);
    }
  } else {
    /* default output file is stdout */
    fp = write_stdout();
  }

  /* Adjust default compression parameters by re-parsing the options */
  file_index = parse_switches(&dstinfo, argc, argv, 0, TRUE);

  /* Specify data destination for compression */
  jpeg_stdio_dest(&dstinfo, fp);

  /* Start compressor (note no image data is actually written here) */
  jpeg_write_coefficients(&dstinfo, dst_coef_arrays);

  /* Copy to the output file any extra markers that we want to preserve */
  jcopy_markers_execute(&srcinfo, &dstinfo, copyoption);

  if (icc_profile != NULL)
    jpeg_write_icc_profile(&dstinfo, icc_profile, (unsigned int)icc_len);

  /* Execute image transformation, if any */
#if TRANSFORMS_SUPPORTED
  jtransform_execute_transformation(&srcinfo, &dstinfo, src_coef_arrays,
                                    &transformoption);
#endif

  /* Finish compression and release memory */
  jpeg_finish_compress(&dstinfo);
  jpeg_destroy_compress(&dstinfo);
#if TRANSFORMS_SUPPORTED
  if (dropfilename != NULL) {
    (void)jpeg_finish_decompress(&dropinfo);
    jpeg_destroy_decompress(&dropinfo);
  }
#endif
  (void)jpeg_finish_decompress(&srcinfo);
  jpeg_destroy_decompress(&srcinfo);

  /* Close output file, if we opened it */
  if (fp != stdout)
    fclose(fp);
#if TRANSFORMS_SUPPORTED
  if (drop_file != NULL)
    fclose(drop_file);
#endif

  if (report)
    end_progress_monitor((j_common_ptr)&dstinfo);
  if (report || max_scans != 0)
    end_progress_monitor((j_common_ptr)&srcinfo);

  free(icc_profile);

  /* All done. */
#if TRANSFORMS_SUPPORTED
  if (dropfilename != NULL)
    exit(jsrcerr.num_warnings + jdroperr.num_warnings +
         jdsterr.num_warnings ? EXIT_WARNING : EXIT_SUCCESS);
#endif
  exit(jsrcerr.num_warnings + jdsterr.num_warnings ?
       EXIT_WARNING : EXIT_SUCCESS);
  return 0;                     /* suppress no-return-value warnings */
}